

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O0

bool __thiscall edk2_vss_t::vss_variable_t::is_auth(vss_variable_t *this)

{
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  vss_variable_attributes_t *pvVar5;
  bool local_23;
  bool local_22;
  bool local_21;
  vss_variable_t *this_local;
  
  if ((this->f_is_auth & 1U) == 0) {
    uVar2 = state(this);
    local_21 = false;
    if (uVar2 != 0xf8) {
      uVar2 = state(this);
      local_21 = false;
      if (uVar2 != 0xfc) {
        pvVar5 = attributes(this);
        bVar3 = vss_variable_attributes_t::auth_write(pvVar5);
        local_22 = true;
        if (!bVar3) {
          pvVar5 = attributes(this);
          bVar3 = vss_variable_attributes_t::time_based_auth(pvVar5);
          local_22 = true;
          if (!bVar3) {
            pvVar5 = attributes(this);
            bVar3 = vss_variable_attributes_t::append_write(pvVar5);
            local_22 = true;
            if (!bVar3) {
              uVar4 = len_name(this);
              local_23 = true;
              if (uVar4 != 0) {
                uVar4 = len_data(this);
                local_23 = uVar4 == 0;
              }
              local_22 = local_23;
            }
          }
        }
        local_21 = local_22;
      }
    }
    this->m_is_auth = local_21;
    this->f_is_auth = true;
    bVar1 = this->m_is_auth;
  }
  else {
    bVar1 = this->m_is_auth;
  }
  this_local._7_1_ = (bool)(bVar1 & 1);
  return this_local._7_1_;
}

Assistant:

bool edk2_vss_t::vss_variable_t::is_auth() {
    if (f_is_auth)
        return m_is_auth;
    m_is_auth =  ((state() != 248) && (state() != 252) && ( (( ((attributes()->auth_write()) || (attributes()->time_based_auth()) || (attributes()->append_write())) ) || ( ((len_name() == 0) || (len_data() == 0)) )) )) ;
    f_is_auth = true;
    return m_is_auth;
}